

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

void Rtm_ObjTransferToBigger(Rtm_Man_t *p,Rtm_Edg_t *pEdge)

{
  int iVar1;
  int iVar2;
  uint *local_28;
  int nExtraAllocNew;
  int nWords;
  Rtm_Edg_t *pEdge_local;
  Rtm_Man_t *p_local;
  
  if (((ulong)*pEdge & 0xf) == 0xf) {
    iVar1 = (int)((*(uint *)pEdge & 0xfff) + 1) >> 4;
    if (p->nExtraAlloc < p->nExtraCur + iVar1 + 1) {
      iVar2 = Abc_MaxInt(p->nExtraAlloc << 1,0x400);
      if (p->pExtra == (uint *)0x0) {
        local_28 = (uint *)malloc((long)iVar2 << 2);
      }
      else {
        local_28 = (uint *)realloc(p->pExtra,(long)iVar2 << 2);
      }
      p->pExtra = local_28;
      p->nExtraAlloc = iVar2;
    }
    memcpy(p->pExtra + p->nExtraCur,p->pExtra + (int)(*(uint *)pEdge >> 0xc),(long)iVar1 << 2);
    p->pExtra[p->nExtraCur + iVar1] = 0;
    *(uint *)pEdge = *(uint *)pEdge & 0xfff | p->nExtraCur << 0xc;
    p->nExtraCur = iVar1 + 1 + p->nExtraCur;
    return;
  }
  __assert_fail("(pEdge->nLats & 15) == 15",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                ,0xc9,"void Rtm_ObjTransferToBigger(Rtm_Man_t *, Rtm_Edg_t *)");
}

Assistant:

void Rtm_ObjTransferToBigger( Rtm_Man_t * p, Rtm_Edg_t * pEdge ) 
{
    int nWords;
    assert( (pEdge->nLats & 15) == 15 );
    nWords = (pEdge->nLats + 1) >> 4;
    if ( p->nExtraCur + nWords + 1 > p->nExtraAlloc )
    {
        int nExtraAllocNew = Abc_MaxInt( 2 * p->nExtraAlloc, 1024 );
        p->pExtra = ABC_REALLOC( unsigned, p->pExtra, nExtraAllocNew );
        p->nExtraAlloc = nExtraAllocNew;
    }
    memcpy( p->pExtra + p->nExtraCur, p->pExtra + pEdge->LData, sizeof(unsigned) * nWords );
    p->pExtra[p->nExtraCur + nWords] = 0;
    pEdge->LData = p->nExtraCur;
    p->nExtraCur += nWords + 1;
}